

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O2

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
RandomTestData<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::get_remainder(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                *__return_storage_ptr__,
               RandomTestData<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               *this,size_t in_times_split)

{
  pointer pbVar1;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  _Var2;
  ulong uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  uVar3 = in_times_split << 5 | 8;
  while (pbVar1 = (this->m_tokens).
                  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        in_times_split <
        (ulong)((long)(this->m_tokens).
                      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
    _Var2._M_current = *(wchar_t **)((long)pbVar1 + (uVar3 - 8));
    std::__cxx11::wstring::insert<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,void>
              ((wstring *)__return_storage_ptr__,
               (const_iterator)
               ((__return_storage_ptr__->_M_dataplus)._M_p +
               __return_storage_ptr__->_M_string_length),_Var2,
               (__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                )(_Var2._M_current + *(long *)((long)&(pbVar1->_M_dataplus)._M_p + uVar3)));
    in_times_split = in_times_split + 1;
    if (in_times_split <
        (ulong)((long)(this->m_tokens).
                      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_tokens).
                      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      _Var2._M_current = (this->m_delim)._M_dataplus._M_p;
      std::__cxx11::wstring::
      insert<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,void>
                ((wstring *)__return_storage_ptr__,
                 (const_iterator)
                 ((__return_storage_ptr__->_M_dataplus)._M_p +
                 __return_storage_ptr__->_M_string_length),_Var2,
                 (__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                  )(_Var2._M_current + (this->m_delim)._M_string_length));
    }
    uVar3 = uVar3 + 0x20;
  }
  return __return_storage_ptr__;
}

Assistant:

StringT get_remainder(size_t in_times_split) {
		StringT result;
		while (in_times_split < m_tokens.size()) {
			auto& token = m_tokens[in_times_split];
			result.insert(result.end(), token.begin(), token.end());
			++in_times_split;
			if (in_times_split < m_tokens.size()) {
				result.insert(result.end(), m_delim.begin(), m_delim.end());
			}
		}

		return result;
	}